

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_or_inplace(void **param_1)

{
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *prVar1;
  char *in_RDI;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1;
  roaring64_bitmap_t *in_stack_00000080;
  roaring64_bitmap_t *in_stack_00000178;
  roaring64_bitmap_t *in_stack_00000180;
  int line;
  
  b = roaring64_bitmap_create();
  prVar1 = roaring64_bitmap_create();
  line = (int)((ulong)prVar1 >> 0x20);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_or_inplace(in_stack_00000180,in_stack_00000178);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_free(in_stack_00000080);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_or_inplace) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    roaring64_bitmap_or_inplace(r1, r2);

    assert_r64_valid(r1);
    assert_true(roaring64_bitmap_contains(r1, 100000));
    assert_true(roaring64_bitmap_contains(r1, 100001));
    assert_true(roaring64_bitmap_contains(r1, 200000));
    assert_true(roaring64_bitmap_contains(r1, 300000));
    assert_true(roaring64_bitmap_contains(r1, 400000));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
}